

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::remove_empty_block(Generator *top)

{
  undefined1 local_58 [8];
  RemoveEmptyBlockVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  RemoveEmptyBlockVisitor::RemoveEmptyBlockVisitor((RemoveEmptyBlockVisitor *)local_58);
  IRVisitor::visit_root
            ((IRVisitor *)local_58,(IRNode *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket)
  ;
  RemoveEmptyBlockVisitor::~RemoveEmptyBlockVisitor((RemoveEmptyBlockVisitor *)local_58);
  return;
}

Assistant:

void remove_empty_block(Generator* top) {
    RemoveEmptyBlockVisitor visitor;
    visitor.visit_root(top);
}